

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O3

Name __thiscall wasm::Literal::getFunc(Literal *this)

{
  char *pcVar1;
  bool bVar2;
  Name NVar3;
  
  bVar2 = Type::isFunction(&this->type);
  if ((bVar2) && (pcVar1 = (this->field_0).func.super_IString.str._M_str, pcVar1 != (char *)0x0)) {
    NVar3.super_IString.str._M_str = pcVar1;
    NVar3.super_IString.str._M_len = (this->field_0).i64;
    return (Name)NVar3.super_IString.str;
  }
  __assert_fail("type.isFunction() && !func.isNull()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x136,"Name wasm::Literal::getFunc() const");
}

Assistant:

Name getFunc() const {
    assert(type.isFunction() && !func.isNull());
    return func;
  }